

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
consistentProperty(pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *__return_storage_ptr__,string *lhs,string *rhs,CompatibleType t)

{
  __type _Var1;
  bool bVar2;
  bool bVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  pair<bool,_const_char_*> pVar5;
  string_view value;
  string_view value_00;
  string null_ptr;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  valueAsString<decltype(nullptr)>(&local_50,lhs);
  _Var1 = std::operator==(lhs,&local_50);
  if (_Var1) {
    _Var1 = std::operator==(rhs,&local_50);
    if (_Var1) {
      __return_storage_ptr__->first = true;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->second,(string *)lhs);
      goto LAB_00355a1a;
    }
  }
  _Var1 = std::operator==(lhs,&local_50);
  if (_Var1) {
    __return_storage_ptr__->first = true;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->second,(string *)rhs);
  }
  else {
    _Var1 = std::operator==(rhs,&local_50);
    if (_Var1) {
      __return_storage_ptr__->first = true;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->second,(string *)lhs);
    }
    else if (t - NumberMinType < 2) {
      pVar5 = consistentNumberProperty((lhs->_M_dataplus)._M_p,(rhs->_M_dataplus)._M_p,t);
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::string::string((string *)&local_70,(string *)&local_50);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,pVar5.second,&local_71);
      }
      __return_storage_ptr__->first = pVar5.first;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->second,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else if (t == StringType) {
      _Var1 = std::operator==(lhs,rhs);
      if (_Var1) {
        std::__cxx11::string::string((string *)&local_70,(string *)lhs);
      }
      else {
        valueAsString<decltype(nullptr)>(&local_70,rhs);
      }
      __return_storage_ptr__->first = _Var1;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->second,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      if (t != BoolType) {
        __assert_fail("false && \"Unreachable!\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorTarget.cxx"
                      ,0x17e3,
                      "std::pair<bool, std::string> consistentProperty(const std::string &, const std::string &, CompatibleType)"
                     );
      }
      value._M_str = extraout_RDX;
      value._M_len = (size_t)(lhs->_M_dataplus)._M_p;
      bVar2 = cmValue::IsOn((cmValue *)lhs->_M_string_length,value);
      value_00._M_str = extraout_RDX_00;
      value_00._M_len = (size_t)(rhs->_M_dataplus)._M_p;
      bVar3 = cmValue::IsOn((cmValue *)rhs->_M_string_length,value_00);
      pbVar4 = &local_50;
      if (bVar3 == bVar2) {
        pbVar4 = lhs;
      }
      __return_storage_ptr__->first = bVar3 == bVar2;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->second,(string *)pbVar4);
    }
  }
LAB_00355a1a:
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

static std::pair<bool, std::string> consistentProperty(const std::string& lhs,
                                                       const std::string& rhs,
                                                       CompatibleType t)
{
  const std::string null_ptr = valueAsString(nullptr);

  if (lhs == null_ptr && rhs == null_ptr) {
    return { true, lhs };
  }
  if (lhs == null_ptr) {
    return { true, rhs };
  }
  if (rhs == null_ptr) {
    return { true, lhs };
  }

  switch (t) {
    case BoolType: {
      bool same = cmIsOn(lhs) == cmIsOn(rhs);
      return { same, same ? lhs : null_ptr };
    }
    case StringType:
      return consistentStringProperty(lhs, rhs);
    case NumberMinType:
    case NumberMaxType: {
      auto value = consistentNumberProperty(lhs.c_str(), rhs.c_str(), t);
      return { value.first,
               value.first ? std::string(value.second) : null_ptr };
    }
  }
  assert(false && "Unreachable!");
  return { false, null_ptr };
}